

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O2

void deqp::gles3::Functional::evalTexture2DShadowOffset(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  IVec2 local_10;
  
  local_10.m_data = *(int (*) [2])(p->offset).m_data;
  fVar1 = texture2DShadowOffset
                    (c,c->in[0].m_data[2],c->in[0].m_data[0],c->in[0].m_data[1],p->lod,&local_10);
  (c->color).m_data[0] = fVar1;
  return;
}

Assistant:

static void		evalTexture2DShadowOffset		(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture2DShadowOffset(c, c.in[0].z(), c.in[0].x(), c.in[0].y(), p.lod, p.offset.swizzle(0,1)); }